

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O0

CpuInfo * asmjit::CpuInfo::getHost(void)

{
  int iVar1;
  CpuInfo *in_stack_ffffffffffffffb8;
  
  if (getHost()::host == '\0') {
    iVar1 = __cxa_guard_acquire(&getHost()::host);
    if (iVar1 != 0) {
      getHost::host.super_CpuInfo._archInfo.field_0 =
           (anon_union_4_2_424c626f_for_ArchInfo_0)
           (anon_struct_4_4_3fa876f7_for_anon_union_4_2_424c626f_for_ArchInfo_0_0)0x0;
      memset(&getHost::host.super_CpuInfo._features,0,0x10);
      memset(&getHost::host,0,0x88);
      detect(in_stack_ffffffffffffffb8);
      __cxa_guard_release(&getHost()::host);
    }
  }
  return &getHost::host.super_CpuInfo;
}

Assistant:

const CpuInfo& CpuInfo::getHost() noexcept {
  static HostCpuInfo host;
  return host;
}